

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse2::
     BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::InstanceIntersector1>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  undefined1 (*pauVar6) [16];
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 (*pauVar10) [16];
  ulong uVar11;
  InstancePrimitive *prim;
  undefined1 (*pauVar12) [16];
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  Precalculations pre;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1029;
  undefined1 local_1028 [16];
  ulong local_1010;
  ulong local_1008;
  RayHit *local_1000;
  RayQueryContext *local_ff8;
  long local_ff0;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_ff8 = context;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar12 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar61 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar65 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar47 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar21 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar22 = (ray->super_RayK<1>).dir.field_0.m128[0];
    fVar23 = (ray->super_RayK<1>).dir.field_0.m128[1];
    fVar48 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fVar49 = (ray->super_RayK<1>).dir.field_0.m128[3];
    fVar51 = 0.0;
    if (0.0 <= fVar21) {
      fVar51 = fVar21;
    }
    fVar21 = (ray->super_RayK<1>).tfar;
    fVar20 = 0.0;
    if (0.0 <= fVar21) {
      fVar20 = fVar21;
    }
    uVar16 = -(uint)(1e-18 <= ABS(fVar22));
    uVar17 = -(uint)(1e-18 <= ABS(fVar23));
    uVar18 = -(uint)(1e-18 <= ABS(fVar48));
    uVar19 = -(uint)(1e-18 <= ABS(fVar49));
    auVar28._0_4_ = (uint)fVar22 & uVar16;
    auVar28._4_4_ = (uint)fVar23 & uVar17;
    auVar28._8_4_ = (uint)fVar48 & uVar18;
    auVar28._12_4_ = (uint)fVar49 & uVar19;
    auVar34._0_8_ = CONCAT44(~uVar17,~uVar16) & 0x219392ef219392ef;
    auVar34._8_4_ = ~uVar18 & 0x219392ef;
    auVar34._12_4_ = ~uVar19 & 0x219392ef;
    auVar34 = auVar34 | auVar28;
    auVar28 = rcpps(auVar28,auVar34);
    fVar55 = auVar28._0_4_;
    fVar56 = auVar28._4_4_;
    fVar58 = auVar28._8_4_;
    fVar55 = (1.0 - auVar34._0_4_ * fVar55) * fVar55 + fVar55;
    fVar56 = (1.0 - auVar34._4_4_ * fVar56) * fVar56 + fVar56;
    fVar58 = (1.0 - auVar34._8_4_ * fVar58) * fVar58 + fVar58;
    uVar8 = (ulong)(fVar55 < 0.0) << 4;
    uVar9 = (ulong)(fVar56 < 0.0) << 4 | 0x20;
    uVar13 = (ulong)(fVar58 < 0.0) << 4 | 0x40;
    uVar7 = uVar8 ^ 0x10;
    uVar14 = uVar9 ^ 0x10;
    local_1000 = ray;
    local_f88 = fVar47;
    fStack_f84 = fVar47;
    fStack_f80 = fVar47;
    fStack_f7c = fVar47;
    local_f98 = fVar51;
    fStack_f94 = fVar51;
    fStack_f90 = fVar51;
    fStack_f8c = fVar51;
    local_fa8 = fVar58;
    fStack_fa4 = fVar58;
    fStack_fa0 = fVar58;
    fStack_f9c = fVar58;
    local_fb8 = fVar61;
    fStack_fb4 = fVar61;
    fStack_fb0 = fVar61;
    fStack_fac = fVar61;
    local_fc8 = fVar65;
    fStack_fc4 = fVar65;
    fStack_fc0 = fVar65;
    fStack_fbc = fVar65;
    local_1008 = uVar8;
    local_fd8 = fVar55;
    fStack_fd4 = fVar55;
    fStack_fd0 = fVar55;
    fStack_fcc = fVar55;
    local_fe8 = fVar56;
    fStack_fe4 = fVar56;
    fStack_fe0 = fVar56;
    fStack_fdc = fVar56;
    local_1010 = uVar9;
    fVar21 = fVar20;
    fVar22 = fVar20;
    fVar23 = fVar20;
    fVar48 = fVar47;
    fVar49 = fVar47;
    fVar50 = fVar47;
    fVar52 = fVar51;
    fVar53 = fVar51;
    fVar54 = fVar51;
    fVar57 = fVar58;
    fVar59 = fVar58;
    fVar60 = fVar58;
    fVar62 = fVar61;
    fVar63 = fVar61;
    fVar64 = fVar61;
    fVar66 = fVar65;
    fVar67 = fVar65;
    fVar68 = fVar65;
    fVar69 = fVar55;
    fVar70 = fVar55;
    fVar71 = fVar55;
    fVar72 = fVar56;
    fVar73 = fVar56;
    fVar74 = fVar56;
LAB_00596023:
    if (pauVar12 != (undefined1 (*) [16])&local_f78) {
      pauVar6 = pauVar12 + -1;
      pauVar12 = pauVar12 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar6 + 8) < *pfVar1 || *(float *)((long)*pauVar6 + 8) == *pfVar1) {
        pauVar6 = (undefined1 (*) [16])&local_f78;
        pauVar10 = *(undefined1 (**) [16])*pauVar12;
        while (((ulong)pauVar10 & 8) == 0) {
          pfVar1 = (float *)((long)pauVar10[2] + uVar8);
          auVar46._0_4_ = (*pfVar1 - fVar61) * fVar55;
          auVar46._4_4_ = (pfVar1[1] - fVar62) * fVar69;
          auVar46._8_4_ = (pfVar1[2] - fVar63) * fVar70;
          auVar46._12_4_ = (pfVar1[3] - fVar64) * fVar71;
          pfVar1 = (float *)((long)pauVar10[2] + uVar9);
          auVar29._0_4_ = (*pfVar1 - fVar65) * fVar56;
          auVar29._4_4_ = (pfVar1[1] - fVar66) * fVar72;
          auVar29._8_4_ = (pfVar1[2] - fVar67) * fVar73;
          auVar29._12_4_ = (pfVar1[3] - fVar68) * fVar74;
          auVar28 = maxps(auVar46,auVar29);
          pfVar1 = (float *)((long)pauVar10[2] + uVar13);
          auVar30._0_4_ = (*pfVar1 - fVar47) * fVar58;
          auVar30._4_4_ = (pfVar1[1] - fVar48) * fVar57;
          auVar30._8_4_ = (pfVar1[2] - fVar49) * fVar59;
          auVar30._12_4_ = (pfVar1[3] - fVar50) * fVar60;
          auVar44._4_4_ = fVar52;
          auVar44._0_4_ = fVar51;
          auVar44._8_4_ = fVar53;
          auVar44._12_4_ = fVar54;
          auVar34 = maxps(auVar30,auVar44);
          local_1028 = maxps(auVar28,auVar34);
          pfVar1 = (float *)((long)pauVar10[2] + uVar7);
          auVar31._0_4_ = (*pfVar1 - fVar61) * fVar55;
          auVar31._4_4_ = (pfVar1[1] - fVar62) * fVar69;
          auVar31._8_4_ = (pfVar1[2] - fVar63) * fVar70;
          auVar31._12_4_ = (pfVar1[3] - fVar64) * fVar71;
          pfVar1 = (float *)((long)pauVar10[2] + uVar14);
          auVar35._0_4_ = (*pfVar1 - fVar65) * fVar56;
          auVar35._4_4_ = (pfVar1[1] - fVar66) * fVar72;
          auVar35._8_4_ = (pfVar1[2] - fVar67) * fVar73;
          auVar35._12_4_ = (pfVar1[3] - fVar68) * fVar74;
          auVar28 = minps(auVar31,auVar35);
          pfVar1 = (float *)((long)pauVar10[2] + (uVar13 ^ 0x10));
          auVar36._0_4_ = (*pfVar1 - fVar47) * fVar58;
          auVar36._4_4_ = (pfVar1[1] - fVar48) * fVar57;
          auVar36._8_4_ = (pfVar1[2] - fVar49) * fVar59;
          auVar36._12_4_ = (pfVar1[3] - fVar50) * fVar60;
          auVar42._4_4_ = fVar21;
          auVar42._0_4_ = fVar20;
          auVar42._8_4_ = fVar22;
          auVar42._12_4_ = fVar23;
          auVar34 = minps(auVar36,auVar42);
          auVar28 = minps(auVar28,auVar34);
          auVar24._4_4_ = -(uint)(local_1028._4_4_ <= auVar28._4_4_);
          auVar24._0_4_ = -(uint)(local_1028._0_4_ <= auVar28._0_4_);
          auVar24._8_4_ = -(uint)(local_1028._8_4_ <= auVar28._8_4_);
          auVar24._12_4_ = -(uint)(local_1028._12_4_ <= auVar28._12_4_);
          uVar16 = movmskps((int)pauVar6,auVar24);
          if (uVar16 == 0) goto LAB_00596023;
          uVar16 = uVar16 & 0xff;
          uVar11 = (ulong)pauVar10 & 0xfffffffffffffff0;
          lVar5 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
            }
          }
          pauVar6 = *(undefined1 (**) [16])(uVar11 + lVar5 * 8);
          uVar16 = uVar16 - 1 & uVar16;
          pauVar10 = pauVar6;
          if (uVar16 != 0) {
            uVar17 = *(uint *)(local_1028 + lVar5 * 4);
            lVar5 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            pauVar10 = *(undefined1 (**) [16])(uVar11 + lVar5 * 8);
            uVar18 = *(uint *)(local_1028 + lVar5 * 4);
            uVar16 = uVar16 - 1 & uVar16;
            if (uVar16 == 0) {
              if (uVar17 < uVar18) {
                *(undefined1 (**) [16])*pauVar12 = pauVar10;
                *(uint *)((long)*pauVar12 + 8) = uVar18;
                pauVar10 = pauVar6;
                pauVar12 = pauVar12 + 1;
              }
              else {
                *(undefined1 (**) [16])*pauVar12 = pauVar6;
                *(uint *)((long)*pauVar12 + 8) = uVar17;
                pauVar6 = pauVar10;
                pauVar12 = pauVar12 + 1;
              }
            }
            else {
              auVar25._8_4_ = uVar17;
              auVar25._0_8_ = pauVar6;
              auVar25._12_4_ = 0;
              auVar32._8_4_ = uVar18;
              auVar32._0_8_ = pauVar10;
              auVar32._12_4_ = 0;
              lVar5 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                }
              }
              uVar4 = *(ulong *)(uVar11 + lVar5 * 8);
              iVar2 = *(int *)(local_1028 + lVar5 * 4);
              auVar37._8_4_ = iVar2;
              auVar37._0_8_ = uVar4;
              auVar37._12_4_ = 0;
              auVar39._8_4_ = -(uint)((int)uVar17 < (int)uVar18);
              uVar16 = uVar16 - 1 & uVar16;
              if (uVar16 == 0) {
                auVar39._4_4_ = auVar39._8_4_;
                auVar39._0_4_ = auVar39._8_4_;
                auVar39._12_4_ = auVar39._8_4_;
                auVar28 = auVar25 & auVar39 | ~auVar39 & auVar32;
                auVar34 = auVar32 & auVar39 | ~auVar39 & auVar25;
                auVar40._8_4_ = -(uint)(auVar28._8_4_ < iVar2);
                auVar40._0_8_ = CONCAT44(auVar40._8_4_,auVar40._8_4_);
                auVar40._12_4_ = auVar40._8_4_;
                pauVar6 = (undefined1 (*) [16])
                          (~auVar40._0_8_ & uVar4 | auVar28._0_8_ & auVar40._0_8_);
                auVar28 = auVar37 & auVar40 | ~auVar40 & auVar28;
                auVar26._8_4_ = -(uint)(auVar34._8_4_ < auVar28._8_4_);
                auVar26._4_4_ = auVar26._8_4_;
                auVar26._0_4_ = auVar26._8_4_;
                auVar26._12_4_ = auVar26._8_4_;
                *pauVar12 = ~auVar26 & auVar34 | auVar28 & auVar26;
                pauVar12[1] = auVar34 & auVar26 | ~auVar26 & auVar28;
                pauVar12 = pauVar12 + 2;
                pauVar10 = pauVar6;
              }
              else {
                lVar5 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                  }
                }
                iVar3 = *(int *)(local_1028 + lVar5 * 4);
                auVar43._8_4_ = iVar3;
                auVar43._0_8_ = *(undefined8 *)(uVar11 + lVar5 * 8);
                auVar43._12_4_ = 0;
                auVar41._4_4_ = auVar39._8_4_;
                auVar41._0_4_ = auVar39._8_4_;
                auVar41._8_4_ = auVar39._8_4_;
                auVar41._12_4_ = auVar39._8_4_;
                auVar28 = auVar25 & auVar41 | ~auVar41 & auVar32;
                auVar34 = auVar32 & auVar41 | ~auVar41 & auVar25;
                auVar45._0_4_ = -(uint)(iVar2 < iVar3);
                auVar45._4_4_ = -(uint)(iVar2 < iVar3);
                auVar45._8_4_ = -(uint)(iVar2 < iVar3);
                auVar45._12_4_ = -(uint)(iVar2 < iVar3);
                auVar42 = auVar37 & auVar45 | ~auVar45 & auVar43;
                auVar46 = ~auVar45 & auVar37 | auVar43 & auVar45;
                auVar38._8_4_ = -(uint)(auVar34._8_4_ < auVar46._8_4_);
                auVar38._4_4_ = auVar38._8_4_;
                auVar38._0_4_ = auVar38._8_4_;
                auVar38._12_4_ = auVar38._8_4_;
                auVar44 = auVar34 & auVar38 | ~auVar38 & auVar46;
                auVar33._8_4_ = -(uint)(auVar28._8_4_ < auVar42._8_4_);
                auVar33._0_8_ = CONCAT44(auVar33._8_4_,auVar33._8_4_);
                auVar33._12_4_ = auVar33._8_4_;
                pauVar6 = (undefined1 (*) [16])
                          (auVar28._0_8_ & auVar33._0_8_ | ~auVar33._0_8_ & auVar42._0_8_);
                auVar28 = ~auVar33 & auVar28 | auVar42 & auVar33;
                auVar27._8_4_ = -(uint)(auVar28._8_4_ < auVar44._8_4_);
                auVar27._4_4_ = auVar27._8_4_;
                auVar27._0_4_ = auVar27._8_4_;
                auVar27._12_4_ = auVar27._8_4_;
                *pauVar12 = ~auVar38 & auVar34 | auVar46 & auVar38;
                pauVar12[1] = ~auVar27 & auVar28 | auVar44 & auVar27;
                pauVar12[2] = auVar28 & auVar27 | ~auVar27 & auVar44;
                pauVar12 = pauVar12 + 3;
                pauVar10 = pauVar6;
              }
            }
          }
        }
        local_ff0 = (ulong)((uint)pauVar10 & 0xf) - 8;
        prim = (InstancePrimitive *)((ulong)pauVar10 & 0xfffffffffffffff0);
        while (bVar15 = local_ff0 != 0, local_ff0 = local_ff0 + -1, bVar15) {
          InstanceIntersector1::intersect(&local_1029,ray,local_ff8,prim);
          prim = prim + 1;
          ray = local_1000;
          uVar8 = local_1008;
          uVar9 = local_1010;
          fVar47 = local_f88;
          fVar48 = fStack_f84;
          fVar49 = fStack_f80;
          fVar50 = fStack_f7c;
          fVar51 = local_f98;
          fVar52 = fStack_f94;
          fVar53 = fStack_f90;
          fVar54 = fStack_f8c;
          fVar58 = local_fa8;
          fVar57 = fStack_fa4;
          fVar59 = fStack_fa0;
          fVar60 = fStack_f9c;
          fVar61 = local_fb8;
          fVar62 = fStack_fb4;
          fVar63 = fStack_fb0;
          fVar64 = fStack_fac;
          fVar65 = local_fc8;
          fVar66 = fStack_fc4;
          fVar67 = fStack_fc0;
          fVar68 = fStack_fbc;
          fVar55 = local_fd8;
          fVar69 = fStack_fd4;
          fVar70 = fStack_fd0;
          fVar71 = fStack_fcc;
          fVar56 = local_fe8;
          fVar72 = fStack_fe4;
          fVar73 = fStack_fe0;
          fVar74 = fStack_fdc;
        }
        fVar20 = (ray->super_RayK<1>).tfar;
        fVar21 = fVar20;
        fVar22 = fVar20;
        fVar23 = fVar20;
      }
      goto LAB_00596023;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }